

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

U32 ZSTD_insertAndFindFirstIndex(ZSTD_matchState_t *ms,BYTE *ip)

{
  undefined4 uVar1;
  uint uVar2;
  undefined4 uVar3;
  long lVar4;
  uint uVar5;
  int in_ESI;
  long in_RDI;
  ZSTD_compressionParameters *cParams;
  size_t h;
  U32 idx;
  U32 target;
  BYTE *base;
  U32 chainMask;
  U32 *chainTable;
  U32 hashLog;
  U32 *hashTable;
  undefined8 in_stack_ffffffffffffff48;
  U32 h_00;
  void *in_stack_ffffffffffffff50;
  void *p;
  uint local_80;
  size_t local_20;
  size_t local_8;
  
  uVar1 = *(undefined4 *)(in_RDI + 0x110);
  p = *(void **)(in_RDI + 0x70);
  uVar2 = *(uint *)(in_RDI + 0x108);
  lVar4 = *(long *)(in_RDI + 0x80);
  uVar3 = *(undefined4 *)(in_RDI + 0x104);
  uVar5 = in_ESI - (int)*(undefined8 *)(in_RDI + 8);
  for (local_80 = *(uint *)(in_RDI + 0x2c); local_80 < uVar5; local_80 = local_80 + 1) {
    if (0x20 < uVar2) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    h_00 = (U32)((ulong)in_stack_ffffffffffffff48 >> 0x20);
    switch(uVar1) {
    default:
      local_8 = ZSTD_hash4Ptr(in_stack_ffffffffffffff50,h_00);
      break;
    case 5:
      local_8 = ZSTD_hash5Ptr(in_stack_ffffffffffffff50,h_00);
      break;
    case 6:
      local_8 = ZSTD_hash6Ptr(in_stack_ffffffffffffff50,h_00);
      break;
    case 7:
      local_8 = ZSTD_hash7Ptr(in_stack_ffffffffffffff50,h_00);
      break;
    case 8:
      local_8 = ZSTD_hash8Ptr(in_stack_ffffffffffffff50,h_00);
    }
    *(undefined4 *)(lVar4 + (ulong)(local_80 & (1 << ((byte)uVar3 & 0x1f)) - 1U) * 4) =
         *(undefined4 *)((long)p + local_8 * 4);
    *(uint *)((long)p + local_8 * 4) = local_80;
  }
  *(uint *)(in_RDI + 0x2c) = uVar5;
  if (uVar2 < 0x21) {
    switch(uVar1) {
    default:
      local_20 = ZSTD_hash4Ptr(p,0);
      break;
    case 5:
      local_20 = ZSTD_hash5Ptr(p,0);
      break;
    case 6:
      local_20 = ZSTD_hash6Ptr(p,0);
      break;
    case 7:
      local_20 = ZSTD_hash7Ptr(p,0);
      break;
    case 8:
      local_20 = ZSTD_hash8Ptr(p,0);
    }
    return *(U32 *)((long)p + local_20 * 4);
  }
  __assert_fail("hBits <= 32",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
}

Assistant:

U32 ZSTD_insertAndFindFirstIndex(ZSTD_matchState_t* ms, const BYTE* ip) {
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    return ZSTD_insertAndFindFirstIndex_internal(ms, cParams, ip, ms->cParams.minMatch, /* lazySkipping*/ 0);
}